

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

void anon_unknown.dwarf_65b09::ProbeCaptureDeviceList(void)

{
  ulong uVar1;
  string names;
  lock_guard<std::recursive_mutex> _;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffffa0;
  string local_50 [8];
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb8;
  once_flag *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  std::call_once<(anonymous_namespace)::ProbeCaptureDeviceList()::__0>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((anonymous_namespace)::CaptureFactory == (long *)0x0) {
    std::__cxx11::string::string(local_30);
    std::__cxx11::string::swap(local_30);
    std::__cxx11::string::~string(local_30);
  }
  else {
    (**(code **)(*(anonymous_namespace)::CaptureFactory + 0x10))
              (local_50,(anonymous_namespace)::CaptureFactory,1);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) {
      std::__cxx11::string::operator+=(local_50,'\0');
    }
    std::__cxx11::string::swap(local_50);
    std::__cxx11::string::~string(local_50);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1813e5);
  return;
}

Assistant:

void ProbeCaptureDeviceList()
{
    DO_INITCONFIG();

    std::lock_guard<std::recursive_mutex> _{ListLock};
    if(!CaptureFactory)
        decltype(alcCaptureDeviceList){}.swap(alcCaptureDeviceList);
    else
    {
        std::string names{CaptureFactory->probe(BackendType::Capture)};
        if(names.empty()) names += '\0';
        names.swap(alcCaptureDeviceList);
    }